

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

Pos getSpawn(Generator *g)

{
  bool bVar1;
  Pos PVar2;
  Pos PVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Generator *pGVar9;
  uint uVar10;
  int *ids;
  int iVar11;
  int tmp;
  int iVar12;
  int iVar13;
  float *y_00;
  int iVar14;
  uint uVar15;
  bool bVar16;
  ulong local_4c80;
  int grass;
  int local_4c70;
  int local_4c6c;
  ulong local_4c68;
  Generator *local_4c60;
  ulong local_4c58;
  ulong local_4c50;
  ulong local_4c48;
  ulong local_4c40;
  ulong local_4c38;
  ulong local_4c30;
  int id;
  float y;
  SurfaceNoise sn;
  
  PVar3 = estimateSpawn(g,&local_4c30);
  local_4c80 = (ulong)PVar3 >> 0x20;
  if (1 < g->mc) {
    local_4c60 = g;
    initSurfaceNoise(&sn,0,g->seed);
    if (local_4c60->mc < 0x10) {
      iVar14 = 999;
      do {
        grass = 0;
        iVar11 = PVar3.x;
        mapApproxHeight(&y,&id,local_4c60,&sn,iVar11 >> 2,(int)local_4c80 >> 2,1,1);
        getBiomeDepthAndScale(id,(double *)0x0,(double *)0x0,&grass);
        if ((grass < 1) || (bVar1 = true, y < (float)grass)) {
          lVar4 = local_4c30 * 0x5deece66d + 0xb;
          lVar5 = lVar4 * 0x5deece66d + 0xb;
          lVar6 = lVar5 * 0x5deece66d + 0xb;
          uVar7 = lVar6 * 0x5deece66d + 0xb;
          local_4c30 = uVar7 & 0xffffffffffff;
          local_4c80 = (ulong)((((uint)((ulong)lVar6 >> 0x2a) & 0x3f) + (int)local_4c80) -
                              ((uint)(uVar7 >> 0x2a) & 0x3f));
          bVar1 = false;
          PVar3.z = 0;
          PVar3.x = (((uint)((ulong)lVar4 >> 0x2a) & 0x3f) + iVar11) -
                    ((uint)((ulong)lVar5 >> 0x2a) & 0x3f);
        }
        bVar16 = iVar14 != 0;
        iVar14 = iVar14 + -1;
      } while ((!bVar1) && (bVar16));
    }
    else {
      local_4c70 = -1;
      if (local_4c60->mc < 0x16) {
        local_4c40 = 0;
        local_4c48 = 0;
        local_4c6c = 0;
        local_4c50 = 0;
        pGVar9 = local_4c60;
        do {
          if (((int)local_4c48 + 0xfU < 0x20) && ((int)local_4c50 + 0xfU < 0x20)) {
            uVar15 = (int)local_4c48 * 0x10 + (PVar3.x & 0xfffffff0U);
            uVar10 = (int)local_4c50 * 0x10 + ((uint)local_4c80 & 0xfffffff0);
            y_00 = &y;
            ids = &id;
            mapApproxHeight(y_00,ids,pGVar9,&sn,(int)uVar15 >> 2,(int)uVar10 >> 2,4,4);
            uVar7 = 0;
            uVar8 = 0;
            local_4c58 = (ulong)uVar15;
            do {
              iVar14 = (int)local_4c58;
              lVar4 = 0;
              local_4c68 = uVar8;
              local_4c38 = uVar7;
              do {
                grass = 0;
                getBiomeDepthAndScale(ids[lVar4],(double *)0x0,(double *)0x0,&grass);
                bVar1 = true;
                if ((0 < grass) && ((float)grass < y_00[lVar4] || (float)grass == y_00[lVar4])) {
                  local_4c80 = (ulong)(uVar10 | (uint)lVar4);
                  bVar1 = false;
                  PVar3.z = 0;
                  PVar3.x = iVar14 + (int)uVar7 * 4;
                }
                uVar8 = local_4c68;
                if (!bVar1) goto LAB_0010cad3;
                lVar4 = lVar4 + 4;
              } while (lVar4 != 0x10);
              uVar7 = local_4c38 + 1;
              uVar8 = (ulong)CONCAT31((int3)((uint)grass >> 8),2 < local_4c38);
              ids = ids + 1;
              y_00 = y_00 + 1;
            } while (uVar7 != 4);
LAB_0010cad3:
            pGVar9 = local_4c60;
            if ((uVar8 & 1) == 0) goto LAB_0010cd24;
          }
          iVar14 = (int)local_4c48;
          iVar11 = (int)local_4c50;
          uVar10 = PVar3.x;
          if (((iVar14 == iVar11) || ((iVar14 < 0 && (iVar14 == -iVar11)))) ||
             ((0 < iVar14 && (iVar14 == 1 - iVar11)))) {
            iVar12 = -local_4c70;
            local_4c70 = local_4c6c;
            local_4c6c = iVar12;
          }
          local_4c48 = (ulong)(uint)(iVar14 + local_4c6c);
          local_4c50 = (ulong)(uint)(iVar11 + local_4c70);
          uVar15 = (int)local_4c40 + 1;
          local_4c40 = (ulong)uVar15;
        } while (uVar15 != 0x400);
      }
      else {
        iVar14 = 0;
        local_4c48 = 0;
        local_4c6c = 0;
        local_4c50 = 0;
        pGVar9 = local_4c60;
        do {
          if (((int)local_4c48 + 5U < 0xb) && (iVar11 = (int)local_4c50, iVar11 + 5U < 0xb)) {
            local_4c58 = (ulong)((int)local_4c48 * 0x10 + (PVar3.x & 0xfffffff0U));
            uVar10 = (uint)local_4c80;
            local_4c38 = 0;
            local_4c40 = CONCAT44(local_4c40._4_4_,iVar14);
            do {
              iVar14 = (int)local_4c58 + (int)local_4c38 * 4;
              local_4c68 = CONCAT44(local_4c68._4_4_,iVar14);
              iVar12 = 0;
              PVar3 = (Pos)((ulong)PVar3 & 0xffffffff);
              do {
                uVar15 = iVar11 * 0x10 + (uVar10 & 0xfffffff0) + iVar12;
                mapApproxHeight(&y,&id,pGVar9,&sn,iVar14 >> 2,(int)uVar15 >> 2,1,1);
                uVar7 = (ulong)uVar15;
                if (63.0 < y) {
                  PVar2 = (Pos)(local_4c68 & 0xffffffff);
                }
                else if ((0x32 < (uint)id) ||
                        (PVar2 = (Pos)(local_4c68 & 0xffffffff),
                        (0x4000000000c00U >> ((ulong)(uint)id & 0x3f) & 1) == 0)) {
                  PVar2 = PVar3;
                  uVar7 = local_4c80;
                }
                local_4c80 = uVar7;
                PVar3 = PVar2;
                if ((63.0 < y) ||
                   (((uint)id < 0x33 && ((0x4000000000c00U >> ((ulong)(uint)id & 0x3f) & 1) != 0))))
                goto LAB_0010cd24;
                iVar12 = iVar12 + 4;
                pGVar9 = local_4c60;
              } while (iVar12 != 0x10);
              uVar15 = (int)local_4c38 + 1;
              local_4c38 = (ulong)uVar15;
              iVar14 = (int)local_4c40;
            } while (uVar15 != 4);
          }
          uVar10 = PVar3.x;
          iVar11 = (int)local_4c48;
          iVar12 = (int)local_4c50;
          if (((iVar11 == iVar12) || ((iVar11 < 0 && (iVar11 == -iVar12)))) ||
             ((0 < iVar11 && (iVar11 == 1 - iVar12)))) {
            iVar13 = -local_4c70;
            local_4c70 = local_4c6c;
            local_4c6c = iVar13;
          }
          local_4c48 = (ulong)(uint)(iVar11 + local_4c6c);
          local_4c50 = (ulong)(uint)(iVar12 + local_4c70);
          iVar14 = iVar14 + 1;
        } while (iVar14 != 0x79);
      }
      PVar3.x = uVar10 & 0xfffffff0 | 8;
      PVar3.z = 0;
      local_4c80 = (ulong)((uint)local_4c80 & 0xfffffff0 | 8);
    }
  }
LAB_0010cd24:
  return (Pos)((ulong)PVar3 & 0xffffffff | local_4c80 << 0x20);
}

Assistant:

Pos getSpawn(const Generator *g)
{
    uint64_t rng;
    Pos spawn = estimateSpawn(g, &rng);
    int i, j, k, u, v, cx0, cz0;
    uint32_t ii, jj;

    if (g->mc <= MC_B1_7)
        return spawn;

    SurfaceNoise sn;
    initSurfaceNoise(&sn, DIM_OVERWORLD, g->seed);

    if (g->mc <= MC_1_12)
    {
        for (i = 0; i < 1000; i++)
        {
            float y;
            int id, grass = 0;
            mapApproxHeight(&y, &id, g, &sn, spawn.x >> 2, spawn.z >> 2, 1, 1);
            getBiomeDepthAndScale(id, 0, 0, &grass);
            if (grass > 0 && y >= grass)
                break;
            spawn.x += nextInt(&rng, 64) - nextInt(&rng, 64);
            spawn.z += nextInt(&rng, 64) - nextInt(&rng, 64);
        }
    }
    else if (g->mc <= MC_1_17)
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 1024; i++)
        {
            if (j > -16 && j <= 16 && k > -16 && k <= 16)
            {
                // find server spawn point in chunk
                float y[16];
                int ids[16];
                cx0 = (spawn.x & ~15) + j * 16; // start of chunk
                cz0 = (spawn.z & ~15) + k * 16;
                mapApproxHeight(y, ids, g, &sn, cx0 >> 2, cz0 >> 2, 4, 4);
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        int grass = 0;
                        getBiomeDepthAndScale(ids[jj*4+ii], 0, 0, &grass);
                        if (grass <= 0 || y[jj*4+ii] < grass)
                            continue;
                        spawn.x = cx0 + ii * 4;
                        spawn.z = cz0 + jj * 4;
                        return spawn;
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }
    else
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 121; i++)
        {
            if (j >= -5 && j <= 5 && k >= -5 && k <= 5)
            {
                // find server spawn point in chunk
                cx0 = (spawn.x & ~15) + j * 16;
                cz0 = (spawn.z & ~15) + k * 16;
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        float y;
                        int id;
                        int x = cx0 + ii * 4;
                        int z = cz0 + jj * 4;
                        mapApproxHeight(&y, &id, g, &sn, x >> 2, z >> 2, 1, 1);
                        if (y > 63 || id == frozen_ocean ||
                            id == deep_frozen_ocean || id == frozen_river)
                        {
                            spawn.x = x;
                            spawn.z = z;
                            return spawn;
                        }
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }

    return spawn;
}